

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddReorder.c
# Opt level: O0

Move * ddSiftingUp(DdManager *table,int y,int xLow)

{
  int y_00;
  int iVar1;
  Move *pMVar2;
  int iVar3;
  int iVar4;
  DdNode *pDVar5;
  int local_4c;
  int L;
  int isolated;
  int yindex;
  int xindex;
  int limitSize;
  int size;
  int x;
  Move *move;
  Move *moves;
  int xLow_local;
  int y_local;
  DdManager *table_local;
  
  move = (Move *)0x0;
  y_00 = table->invperm[y];
  yindex = table->keys - table->isolated;
  local_4c = yindex;
  for (limitSize = xLow + 1; limitSize < y; limitSize = limitSize + 1) {
    iVar1 = table->invperm[limitSize];
    iVar3 = cuddTestInteract(table,iVar1,y_00);
    if (iVar3 != 0) {
      local_4c = local_4c -
                 (table->subtables[limitSize].keys - (uint)(table->vars[iVar1]->ref == 1));
    }
  }
  local_4c = local_4c - (table->subtables[y].keys - (uint)(table->vars[y_00]->ref == 1));
  limitSize = cuddNextLow(table,y);
  moves._4_4_ = y;
  while( true ) {
    if (limitSize < xLow || yindex < local_4c) {
      return move;
    }
    iVar1 = table->invperm[limitSize];
    iVar3 = cuddSwapInPlace(table,limitSize,moves._4_4_);
    if (iVar3 == 0) break;
    iVar4 = cuddTestInteract(table,iVar1,y_00);
    if (iVar4 != 0) {
      local_4c = (table->subtables[(int)moves._4_4_].keys - (uint)(table->vars[iVar1]->ref == 1)) +
                 local_4c;
    }
    pDVar5 = cuddDynamicAllocNode(table);
    if (pDVar5 == (DdNode *)0x0) break;
    pDVar5->index = limitSize;
    pDVar5->ref = moves._4_4_;
    *(int *)((long)&pDVar5->next + 4) = iVar3;
    (pDVar5->type).kids.T = (DdNode *)move;
    if ((double)yindex * table->maxGrowth < (double)iVar3) {
      return (Move *)pDVar5;
    }
    if (iVar3 < yindex) {
      yindex = iVar3;
    }
    moves._4_4_ = limitSize;
    limitSize = cuddNextLow(table,limitSize);
    move = (Move *)pDVar5;
  }
  while (move != (Move *)0x0) {
    pMVar2 = move->next;
    move->y = 0;
    *(DdNode **)&move->flags = table->nextFree;
    table->nextFree = (DdNode *)move;
    move = pMVar2;
  }
  return (Move *)0xffffffffffffffff;
}

Assistant:

static Move *
ddSiftingUp(
  DdManager * table,
  int  y,
  int  xLow)
{
    Move        *moves;
    Move        *move;
    int         x;
    int         size;
    int         limitSize;
    int         xindex, yindex;
    int         isolated;
    int         L;      /* lower bound on DD size */
#ifdef DD_DEBUG
    int checkL;
    int z;
    int zindex;
#endif

    moves = NULL;
    yindex = table->invperm[y];

    /* Initialize the lower bound.
    ** The part of the DD below y will not change.
    ** The part of the DD above y that does not interact with y will not
    ** change. The rest may vanish in the best case, except for
    ** the nodes at level xLow, which will not vanish, regardless.
    */
    limitSize = L = table->keys - table->isolated;
    for (x = xLow + 1; x < y; x++) {
        xindex = table->invperm[x];
        if (cuddTestInteract(table,xindex,yindex)) {
            isolated = table->vars[xindex]->ref == 1;
            L -= table->subtables[x].keys - isolated;
        }
    }
    isolated = table->vars[yindex]->ref == 1;
    L -= table->subtables[y].keys - isolated;

    x = cuddNextLow(table,y);
    while (x >= xLow && L <= limitSize) {
        xindex = table->invperm[x];
#ifdef DD_DEBUG
        checkL = table->keys - table->isolated;
        for (z = xLow + 1; z < y; z++) {
            zindex = table->invperm[z];
            if (cuddTestInteract(table,zindex,yindex)) {
                isolated = table->vars[zindex]->ref == 1;
                checkL -= table->subtables[z].keys - isolated;
            }
        }
        isolated = table->vars[yindex]->ref == 1;
        checkL -= table->subtables[y].keys - isolated;
        assert(L == checkL);
#endif
        size = cuddSwapInPlace(table,x,y);
        if (size == 0) goto ddSiftingUpOutOfMem;
        /* Update the lower bound. */
        if (cuddTestInteract(table,xindex,yindex)) {
            isolated = table->vars[xindex]->ref == 1;
            L += table->subtables[y].keys - isolated;
        }
        move = (Move *) cuddDynamicAllocNode(table);
        if (move == NULL) goto ddSiftingUpOutOfMem;
        move->x = x;
        move->y = y;
        move->size = size;
        move->next = moves;
        moves = move;
        if ((double) size > (double) limitSize * table->maxGrowth) break;
        if (size < limitSize) limitSize = size;
        y = x;
        x = cuddNextLow(table,y);
    }
    return(moves);

ddSiftingUpOutOfMem:
    while (moves != NULL) {
        move = moves->next;
        cuddDeallocMove(table, moves);
        moves = move;
    }
    return((Move *) CUDD_OUT_OF_MEM);

}